

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.h
# Opt level: O3

void __thiscall
kway_min_id_heap<int,_4,_std::less<int>_>::push
          (kway_min_id_heap<int,_4,_std::less<int>_> *this,int id,key_type key)

{
  ulong *puVar1;
  pointer piVar2;
  ulong uVar3;
  int iVar4;
  
  uVar3 = (ulong)id;
  iVar4 = id + 0x3f;
  if (-1 < id) {
    iVar4 = id;
  }
  puVar1 = (this->contained_flags).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
           (long)(iVar4 >> 6) +
           (ulong)((uVar3 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
  *puVar1 = *puVar1 | 1L << (uVar3 & 0x3f);
  iVar4 = this->heap_end;
  this->heap_end = iVar4 + 1;
  piVar2 = (this->heap).
           super__Vector_base<kway_min_id_heap<int,_4,_std::less<int>_>::id_key_pair,_std::allocator<kway_min_id_heap<int,_4,_std::less<int>_>::id_key_pair>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar2[iVar4].id = id;
  piVar2[iVar4].key = key;
  (this->id_pos).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[uVar3] = iVar4;
  move_up(this,iVar4);
  return;
}

Assistant:

void push(int id, key_type key)
    {
        assert(0 <= id && id < (int)id_pos.size() && "id is in range");
        assert(!contains(id) && "can not push an already existing id");

        contained_flags[id] = true;

        int new_pos = heap_end;
        ++heap_end;
        heap[new_pos].id = id;
        heap[new_pos].key = std::move(key);
        id_pos[id] = new_pos;
        move_up(new_pos);

        check_id_invariants();
        check_order_invariants();
    }